

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_single.h
# Opt level: O3

Allocation * __thiscall
density::detail::
LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::consistency_model)0>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)2,1ul,true,16ul,8ul>
          (Allocation *__return_storage_ptr__,void *this)

{
  LfQueueControl *pLVar1;
  uintptr_t uVar2;
  undefined8 *puVar3;
  ulong uVar4;
  void *pvVar5;
  
  while( true ) {
    uVar4 = *this;
    if (uVar4 == 0 || (uVar4 & 0x3f) != 0) {
      density_tests::detail::assert_failed<>
                ("m_tail != 0 && uint_is_aligned(m_tail, s_alloc_granularity)",
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
                 ,0xeb);
      uVar4 = *this;
    }
    puVar3 = (undefined8 *)(uVar4 + 0x5f & 0xffffffffffffffc0);
    if ((long)puVar3 - (uVar4 & 0xffffffffffff0000) < 0xffc1) break;
    uVar2 = LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
            ::page_overflow((LFQueue_Tail<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
                             *)this,LfQueue_LockFree);
    if (uVar2 == 0) {
      pvVar5 = (void *)0x0;
LAB_00b057b1:
      __return_storage_ptr__->m_user_storage = pvVar5;
      return __return_storage_ptr__;
    }
  }
  LOCK();
  *puVar3 = 0;
  UNLOCK();
  pLVar1 = *this;
  if (pLVar1->m_next != 0) {
    density_tests::detail::assert_failed<>
              ("raw_atomic_load(&new_block->m_next, mem_relaxed) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_single.h"
               ,0x10f);
  }
  LOCK();
  pLVar1->m_next = (ulong)puVar3 | 1;
  UNLOCK();
  pvVar5 = (void *)(uVar4 + 0x10);
  *(undefined8 **)this = puVar3;
  __return_storage_ptr__->m_control_block = pLVar1;
  __return_storage_ptr__->m_next_ptr = (ulong)puVar3 | 1;
  goto LAB_00b057b1;
}

Assistant:

Allocation try_inplace_allocate_impl() noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                static_assert(
                  (CONTROL_BITS & ~(LfQueue_Dead | LfQueue_External | LfQueue_Busy)) == 0,
                  "internal error");
                static_assert(
                  is_power_of_2(ALIGNMENT) && (SIZE % ALIGNMENT) == 0, "internal error");

                constexpr size_t alignment = size_max(ALIGNMENT, min_alignment);
                constexpr size_t size      = uint_upper_align(SIZE, alignment);
                constexpr bool   can_fit_in_a_page =
                  size + (alignment - min_alignment) <= s_max_size_inpage;
                constexpr bool over_aligned = alignment > min_alignment;

                for (;;)
                {
                    DENSITY_ASSERT_INTERNAL(
                      m_tail != 0 && uint_is_aligned(m_tail, s_alloc_granularity));

                    // allocate space for the control block (and possibly the runtime type)
                    auto new_tail =
                      m_tail + (INCLUDE_TYPE ? s_element_min_offset : s_rawblock_min_offset);

                    // allocate the user space
                    if (over_aligned)
                        new_tail = uint_upper_align(new_tail, alignment);
                    DENSITY_ASSUME_UINT_ALIGNED(new_tail, alignment);
                    auto const user_storage = reinterpret_cast<void *>(new_tail);
                    new_tail = uint_upper_align(new_tail + size, s_alloc_granularity);

                    // check for page overflow
                    auto const page_start =
                      uint_lower_align(m_tail, ALLOCATOR_TYPE::page_alignment);
                    DENSITY_ASSUME(new_tail > page_start);
                    auto const new_tail_offset = new_tail - page_start;
                    if (DENSITY_LIKELY(new_tail_offset <= s_end_control_offset))
                    {
                        /* null-terminate the next control-block before updating the new one, to prevent
                        consumers from reaching an unitialized area. No memory ordering is required here */
                        raw_atomic_store(
                          &reinterpret_cast<ControlBlock *>(new_tail)->m_next,
                          uintptr_t(0),
                          mem_relaxed);
                        /* to investigate: this may probably be a non-atomic operation, because consumers can only
                            read this after acquiring the next write (to new_block->m_next). Anyway clang tsan
                            has reported it has a data race. Furthermore atomicity in this case should have no
                            consequences on the generated code. */

                        /* setup the new control block. Here we use release ordering so that consumers
                            acquiring this control block can see the previous write. */
                        auto const new_block = reinterpret_cast<ControlBlock *>(m_tail);
                        auto const next_ptr  = new_tail + CONTROL_BITS;
                        DENSITY_ASSERT_INTERNAL(
                          raw_atomic_load(&new_block->m_next, mem_relaxed) == 0);
                        raw_atomic_store(&new_block->m_next, next_ptr, mem_release);

                        // commit the allocation
                        m_tail = new_tail;
                        return {new_block, next_ptr, user_storage};
                    }
                    else if (can_fit_in_a_page) // if this allocation may fit in a page
                    {
                        /* allocate another page. Note: on success page_overflow sets m_tail to the beginning of
                            the new page */
                        auto const result = page_overflow(PROGRESS_GUARANTEE);
                        if (guarantee != LfQueue_Throwing)
                        {
                            if (result == 0)
                            {
                                return Allocation{};
                            }
                        }
                        else
                        {
                            // with LfQueue_Throwing page_overflow throws on failure
                            DENSITY_ASSUME(result != 0);
                        }
                    }
                    else // this allocation would never fit in a page, allocate an external block
                    {
                        // legacy heap allocations can only be blocking
                        if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                            return Allocation{};

                        return Base::template external_allocate<PROGRESS_GUARANTEE>(
                          CONTROL_BITS, size, alignment);
                    }
                }
            }